

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall
UnicodeFullTest_string_cast_Test<std::pair<char32_t,_char32_t>_>::UnicodeFullTest_string_cast_Test
          (UnicodeFullTest_string_cast_Test<std::pair<char32_t,_char32_t>_> *this)

{
  UnicodeFullTest_string_cast_Test<std::pair<char32_t,_char32_t>_> *this_local;
  
  UnicodeFullTest<std::pair<char32_t,_char32_t>_>::UnicodeFullTest
            (&this->super_UnicodeFullTest<std::pair<char32_t,_char32_t>_>);
  *(undefined ***)&this->super_UnicodeFullTest<std::pair<char32_t,_char32_t>_> =
       &PTR__UnicodeFullTest_string_cast_Test_008142a0;
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, string_cast) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");
	std::basic_string_view<typename TypeParam::first_type> abcd_string_view = abcd_str;

	EXPECT_TRUE(equals(abcd_str,
		string_cast<typename TypeParam::second_type>(abcd_str)));
	EXPECT_TRUE(is_valid(abcd_str));

	EXPECT_TRUE(equals(abcd_string_view,
		string_cast<typename TypeParam::second_type>(abcd_string_view)));
	EXPECT_TRUE(is_valid(abcd_string_view));
}